

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O0

void __thiscall
myvk::ImGuiRenderer::CmdDrawPipeline
          (ImGuiRenderer *this,Ptr<CommandBuffer> *command_buffer,uint32_t current_frame)

{
  initializer_list<VkRect2D> __l;
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  VkDeviceSize VVar5;
  element_type *peVar6;
  uint in_EDX;
  Ptr<Device> *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Ptr<CommandBuffer> *in_stack_00000008;
  ImGuiRenderer *in_stack_00000010;
  VkRect2D scissor;
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  int cmd_i;
  ImDrawList *cmd_list_1;
  int n;
  int global_idx_offset;
  int global_vtx_offset;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  ImDrawList *cmd_list;
  int i;
  ImDrawIdx *index_ptr;
  ImDrawVert *vertex_ptr;
  VkDeviceSize index_size;
  VkDeviceSize vertex_size;
  value_type *index_buffer;
  value_type *vertex_buffer;
  int fb_height;
  int fb_width;
  ImDrawData *draw_data;
  Ptr<Device> *device;
  allocator_type *in_stack_fffffffffffffe28;
  int32_t in_stack_fffffffffffffe30;
  uint32_t in_stack_fffffffffffffe34;
  ImDrawVert *in_stack_fffffffffffffe38;
  ImDrawVert *in_stack_fffffffffffffe40;
  CommandBuffer *this_00;
  allocator_type *in_stack_fffffffffffffe58;
  vector<VkRect2D,_std::allocator<VkRect2D>_> *in_stack_fffffffffffffe60;
  long in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  allocator_type *paVar7;
  vector<VkRect2D,_std::allocator<VkRect2D>_> *in_stack_fffffffffffffe78;
  VkDeviceSize in_stack_fffffffffffffe80;
  allocator<VkRect2D> local_169 [9];
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffea0;
  ImVec4 local_120;
  ImDrawCmd *local_110;
  int local_104;
  ImDrawList *local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImDrawList *local_d8;
  int local_cc;
  void *local_c8;
  void *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ulong local_50;
  ulong local_48;
  __shared_ptr *local_40;
  __shared_ptr *local_38;
  int local_30;
  int local_2c;
  ImDrawData *local_28;
  vector<VkRect2D,_std::allocator<VkRect2D>_> *local_20;
  uint local_14;
  Ptr<Device> *pPVar8;
  
  local_14 = in_EDX;
  pPVar8 = in_RDI;
  peVar4 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x295bb8);
  iVar2 = (*(peVar4->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_20 = (vector<VkRect2D,_std::allocator<VkRect2D>_> *)CONCAT44(extraout_var,iVar2);
  local_28 = ImGui::GetDrawData();
  local_2c = (int)((local_28->DisplaySize).x * (local_28->FramebufferScale).x);
  local_30 = (int)((local_28->DisplaySize).y * (local_28->FramebufferScale).y);
  if (local_2c < 1) {
    return;
  }
  if (local_30 < 1) {
    return;
  }
  if (local_28->TotalVtxCount == 0) {
    return;
  }
  local_38 = (__shared_ptr *)
             std::
             vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
             ::operator[]((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
                           *)&in_RDI[6].super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,(ulong)local_14);
  local_40 = (__shared_ptr *)
             std::
             vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
             ::operator[]((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
                           *)(in_RDI + 8),(ulong)local_14);
  local_48 = (long)local_28->TotalVtxCount * 0x14;
  local_50 = (long)local_28->TotalIdxCount << 1;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
  if (bVar1) {
    peVar6 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x295cd7);
    VVar5 = BufferBase::GetSize(&peVar6->super_BufferBase);
    if (VVar5 < local_48) goto LAB_00295d13;
    peVar6 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x295cf6);
    VVar5 = BufferBase::GetSize(&peVar6->super_BufferBase);
    paVar7 = (allocator_type *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70);
    if (local_48 << 2 < VVar5) goto LAB_00295d13;
  }
  else {
LAB_00295d13:
    in_stack_fffffffffffffe80 = local_48 * 2;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    in_stack_fffffffffffffe28 = (allocator_type *)&local_78;
    in_stack_fffffffffffffe78 = local_20;
    std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
    vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
           0x295d59);
    paVar7 = in_stack_fffffffffffffe28;
    Buffer::Create(in_RDI,in_stack_fffffffffffffe80,
                   (VmaAllocationCreateFlags)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                   (VkBufferUsageFlags)in_stack_fffffffffffffe78,
                   (VmaMemoryUsage)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                   in_stack_fffffffffffffea0);
    std::shared_ptr<myvk::Buffer>::operator=
              ((shared_ptr<myvk::Buffer> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (shared_ptr<myvk::Buffer> *)in_stack_fffffffffffffe28);
    std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x295db0);
    std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
    ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            in_stack_fffffffffffffe40);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
  if (bVar1) {
    peVar6 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x295e05);
    VVar5 = BufferBase::GetSize(&peVar6->super_BufferBase);
    if (local_50 <= VVar5) {
      peVar6 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x295e24);
      VVar5 = BufferBase::GetSize(&peVar6->super_BufferBase);
      if (VVar5 <= local_50 << 2) goto LAB_00295f13;
    }
  }
  in_stack_fffffffffffffe68 = local_50 * 2;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  in_stack_fffffffffffffe28 = (allocator_type *)&local_b8;
  in_stack_fffffffffffffe60 = local_20;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x295e87);
  in_stack_fffffffffffffe58 = in_stack_fffffffffffffe28;
  Buffer::Create(in_RDI,in_stack_fffffffffffffe80,
                 (VmaAllocationCreateFlags)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                 (VkBufferUsageFlags)in_stack_fffffffffffffe78,
                 (VmaMemoryUsage)((ulong)paVar7 >> 0x20),in_stack_fffffffffffffea0);
  std::shared_ptr<myvk::Buffer>::operator=
            ((shared_ptr<myvk::Buffer> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (shared_ptr<myvk::Buffer> *)in_stack_fffffffffffffe28);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x295ede);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffe40);
LAB_00295f13:
  peVar6 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x295f20);
  local_c0 = Buffer::GetMappedData(peVar6);
  peVar6 = std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x295f3d);
  local_c8 = Buffer::GetMappedData(peVar6);
  for (local_cc = 0; local_cc < local_28->CmdListsCount; local_cc = local_cc + 1) {
    local_d8 = local_28->CmdLists[local_cc];
    ImVector<ImDrawVert>::begin(&local_d8->VtxBuffer);
    ImVector<ImDrawVert>::end(&local_d8->VtxBuffer);
    std::copy<ImDrawVert_const*,ImDrawVert*>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (ImDrawVert *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    ImVector<unsigned_short>::begin(&local_d8->IdxBuffer);
    ImVector<unsigned_short>::end(&local_d8->IdxBuffer);
    std::copy<unsigned_short_const*,unsigned_short*>
              ((unsigned_short *)in_stack_fffffffffffffe40,
               (unsigned_short *)in_stack_fffffffffffffe38,
               (unsigned_short *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    local_c0 = (void *)((long)local_c0 + (long)(local_d8->VtxBuffer).Size * 0x14);
    local_c8 = (void *)((long)local_c8 + (long)(local_d8->IdxBuffer).Size * 2);
  }
  setup_render_state(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                     (uint32_t)((ulong)pPVar8 >> 0x20));
  local_e0 = local_28->DisplayPos;
  local_e8 = local_28->FramebufferScale;
  local_ec = 0;
  local_f0 = 0;
  for (local_f4 = 0; local_f4 < local_28->CmdListsCount; local_f4 = local_f4 + 1) {
    local_100 = local_28->CmdLists[local_f4];
    for (local_104 = 0; local_104 < (local_100->CmdBuffer).Size; local_104 = local_104 + 1) {
      local_110 = ImVector<ImDrawCmd>::operator[](&local_100->CmdBuffer,local_104);
      if (local_110->UserCallback == (ImDrawCallback)0x0) {
        ImVec4::ImVec4(&local_120);
        local_120.x = ((local_110->ClipRect).x - local_e0.x) * local_e8.x;
        local_120.y = ((local_110->ClipRect).y - local_e0.y) * local_e8.y;
        local_120.z = ((local_110->ClipRect).z - local_e0.x) * local_e8.x;
        local_120.w = ((local_110->ClipRect).w - local_e0.y) * local_e8.y;
        if ((((local_120.x < (float)local_2c) && (local_120.y < (float)local_30)) &&
            (0.0 <= local_120.z)) && (0.0 <= local_120.w)) {
          if (local_120.x < 0.0) {
            local_120.x = 0.0;
          }
          if (local_120.y < 0.0) {
            local_120.y = 0.0;
          }
          iVar2 = (int)local_120.x;
          iVar3 = (int)local_120.y;
          peVar4 = std::
                   __shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x29636e);
          local_169._5_4_ = iVar3;
          local_169._1_4_ = iVar2;
          this_00 = (CommandBuffer *)local_169;
          std::allocator<VkRect2D>::allocator((allocator<VkRect2D> *)0x2963a8);
          __l._M_len._0_4_ = (int)paVar7;
          __l._M_array = (iterator)in_stack_fffffffffffffe68;
          __l._M_len._4_4_ = (int)((ulong)paVar7 >> 0x20);
          std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
                    (in_stack_fffffffffffffe60,__l,in_stack_fffffffffffffe58);
          CommandBuffer::CmdSetScissor
                    (this_00,(vector<VkRect2D,_std::allocator<VkRect2D>_> *)peVar4);
          std::vector<VkRect2D,_std::allocator<VkRect2D>_>::~vector
                    ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)this_00);
          std::allocator<VkRect2D>::~allocator(local_169);
          std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x296404);
          CommandBuffer::CmdDrawIndexed
                    (this_00,(uint32_t)((ulong)peVar4 >> 0x20),(uint32_t)peVar4,
                     in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                     (uint32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20));
        }
      }
      else if (local_110->UserCallback == (ImDrawCallback)0xffffffffffffffff) {
        setup_render_state(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                           (uint32_t)((ulong)pPVar8 >> 0x20));
      }
      else {
        (*local_110->UserCallback)(local_100,local_110);
      }
    }
    local_f0 = (local_100->IdxBuffer).Size + local_f0;
    local_ec = (local_100->VtxBuffer).Size + local_ec;
  }
  return;
}

Assistant:

void ImGuiRenderer::CmdDrawPipeline(const Ptr<CommandBuffer> &command_buffer, uint32_t current_frame) const {
	const Ptr<Device> &device = command_buffer->GetDevicePtr();

	ImDrawData *draw_data = ImGui::GetDrawData();

	int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
	int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
	if (fb_width <= 0 || fb_height <= 0 || draw_data->TotalVtxCount == 0)
		return;

	auto &vertex_buffer = m_vertex_buffers[current_frame];
	auto &index_buffer = m_index_buffers[current_frame];
	// Fill vertex buffer and index buffer
	{
		VkDeviceSize vertex_size = draw_data->TotalVtxCount * sizeof(ImDrawVert);
		VkDeviceSize index_size = draw_data->TotalIdxCount * sizeof(ImDrawIdx);
		if (!vertex_buffer || vertex_buffer->GetSize() < vertex_size || vertex_buffer->GetSize() > vertex_size * 4) {
			vertex_buffer =
			    Buffer::Create(device, vertex_size * 2,
			                   VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT | VMA_ALLOCATION_CREATE_MAPPED_BIT,
			                   VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		}
		if (!index_buffer || index_buffer->GetSize() < index_size || index_buffer->GetSize() > index_size * 4) {
			index_buffer = Buffer::Create(
			    device, index_size * 2, VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT | VMA_ALLOCATION_CREATE_MAPPED_BIT,
			    VK_BUFFER_USAGE_INDEX_BUFFER_BIT);
		}

		auto *vertex_ptr = (ImDrawVert *)vertex_buffer->GetMappedData();
		auto *index_ptr = (ImDrawIdx *)index_buffer->GetMappedData();
		for (int i = 0; i < draw_data->CmdListsCount; ++i) {
			const ImDrawList *cmd_list = draw_data->CmdLists[i];
			std::copy(cmd_list->VtxBuffer.begin(), cmd_list->VtxBuffer.end(), vertex_ptr);
			std::copy(cmd_list->IdxBuffer.begin(), cmd_list->IdxBuffer.end(), index_ptr);
			vertex_ptr += cmd_list->VtxBuffer.Size;
			index_ptr += cmd_list->IdxBuffer.Size;
		}
	}

	setup_render_state(command_buffer, fb_width, fb_height, current_frame);

	// Will project scissor/clipping rectangles into framebuffer space
	ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
	ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

	// Render command lists
	// (Because we merged all buffers into a single one, we maintain our own offset into them)
	int global_vtx_offset = 0;
	int global_idx_offset = 0;
	for (int n = 0; n < draw_data->CmdListsCount; n++) {
		const ImDrawList *cmd_list = draw_data->CmdLists[n];
		for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++) {
			const ImDrawCmd *pcmd = &cmd_list->CmdBuffer[cmd_i];
			if (pcmd->UserCallback) {
				// User callback, registered via ImDrawList::AddCallback()
				// (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer
				// to reset render state.)
				if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
					setup_render_state(command_buffer, fb_width, fb_height, current_frame);
				else
					pcmd->UserCallback(cmd_list, pcmd);
			} else {
				// Project scissor/clipping rectangles into framebuffer space
				ImVec4 clip_rect;
				clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
				clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
				clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
				clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

				if (clip_rect.x < (float)fb_width && clip_rect.y < (float)fb_height && clip_rect.z >= 0.0f &&
				    clip_rect.w >= 0.0f) {
					// Negative offsets are illegal for vkCmdSetScissor
					if (clip_rect.x < 0.0f)
						clip_rect.x = 0.0f;
					if (clip_rect.y < 0.0f)
						clip_rect.y = 0.0f;

					// Apply scissor/clipping rectangle
					VkRect2D scissor;
					scissor.offset.x = (int32_t)clip_rect.x;
					scissor.offset.y = (int32_t)clip_rect.y;
					scissor.extent.width = (uint32_t)(clip_rect.z - clip_rect.x);
					scissor.extent.height = (uint32_t)(clip_rect.w - clip_rect.y);
					command_buffer->CmdSetScissor({scissor});
					command_buffer->CmdDrawIndexed(pcmd->ElemCount, 1, pcmd->IdxOffset + global_idx_offset,
					                               pcmd->VtxOffset + global_vtx_offset, 0);
				}
			}
		}
		global_idx_offset += cmd_list->IdxBuffer.Size;
		global_vtx_offset += cmd_list->VtxBuffer.Size;
	}
}